

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2_test.cc
# Opt level: O0

void __thiscall BLAKE2B256Test_ABC_Test::TestBody(BLAKE2B256Test_ABC_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_c8;
  Message local_c0 [3];
  Span<const_unsigned_char> local_a8;
  Bytes local_98;
  Span<const_unsigned_char> local_88;
  Bytes local_78;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  uint8_t digest [32];
  uint8_t kExpected [32];
  BLAKE2B256Test_ABC_Test *this_local;
  
  digest[0x18] = 0xbd;
  digest[0x19] = 0xdd;
  digest[0x1a] = 0x81;
  digest[0x1b] = '<';
  digest[0x1c] = 'c';
  digest[0x1d] = 'B';
  digest[0x1e] = '9';
  digest[0x1f] = 'r';
  BLAKE2B256((uint8_t *)"abc",3,(uint8_t *)&gtest_ar.message_);
  bssl::Span<unsigned_char_const>::Span<32ul>
            ((Span<unsigned_char_const> *)&local_88,(uchar (*) [32])(digest + 0x18));
  Bytes::Bytes(&local_78,local_88);
  bssl::Span<unsigned_char_const>::Span<32ul>
            ((Span<unsigned_char_const> *)&local_a8,(uchar (*) [32])&gtest_ar.message_);
  Bytes::Bytes(&local_98,local_a8);
  testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
            ((EqHelper *)local_68,"Bytes(kExpected)","Bytes(digest)",&local_78,&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_c0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/blake2/blake2_test.cc"
               ,0x21,message);
    testing::internal::AssertHelper::operator=(&local_c8,local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  return;
}

Assistant:

TEST(BLAKE2B256Test, ABC) {
  // https://tools.ietf.org/html/rfc7693#appendix-A, except updated for the
  // 256-bit hash output.
  const uint8_t kExpected[] = {
      0xbd, 0xdd, 0x81, 0x3c, 0x63, 0x42, 0x39, 0x72, 0x31, 0x71, 0xef,
      0x3f, 0xee, 0x98, 0x57, 0x9b, 0x94, 0x96, 0x4e, 0x3b, 0xb1, 0xcb,
      0x3e, 0x42, 0x72, 0x62, 0xc8, 0xc0, 0x68, 0xd5, 0x23, 0x19,
  };

  uint8_t digest[BLAKE2B256_DIGEST_LENGTH];
  BLAKE2B256((const uint8_t *)"abc", 3, digest);
  EXPECT_EQ(Bytes(kExpected), Bytes(digest));
}